

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O2

void __thiscall
cmServerPipeConnection::cmServerPipeConnection(cmServerPipeConnection *this,string *name)

{
  cmConnectionBufferStrategy *bufferStrategy;
  
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(0x28);
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmServerBufferStrategy_006321f0;
  bufferStrategy[1]._vptr_cmConnectionBufferStrategy = (_func_int **)(bufferStrategy + 3);
  bufferStrategy[2]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  *(undefined1 *)&bufferStrategy[3]._vptr_cmConnectionBufferStrategy = 0;
  cmPipeConnection::cmPipeConnection(&this->super_cmPipeConnection,name,bufferStrategy);
  (this->super_cmPipeConnection).super_cmEventBasedConnection.super_cmConnection._vptr_cmConnection
       = (_func_int **)&PTR_WriteData_00632288;
  return;
}

Assistant:

cmServerPipeConnection::cmServerPipeConnection(const std::string& name)
  : cmPipeConnection(name, new cmServerBufferStrategy)
{
}